

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNA::SetVolumeADPCM(OPNA *this,int db)

{
  int iVar1;
  double dVar2;
  int db_local;
  OPNA *this_local;
  
  iVar1 = Min(db,0x14);
  if (iVar1 < -0xbf) {
    (this->super_OPNABase).adpcmvol = 0;
  }
  else {
    dVar2 = pow(10.0,(double)iVar1 / 40.0);
    (this->super_OPNABase).adpcmvol = (int)(dVar2 * 65536.0);
  }
  (this->super_OPNABase).adpcmvolume =
       (this->super_OPNABase).adpcmvol * (this->super_OPNABase).adpcmlevel >> 0xc;
  return;
}

Assistant:

void OPNA::SetVolumeADPCM(int db)
{
	db = Min(db, 20);
	if (db > -192)
		adpcmvol = int(65536.0 * pow(10.0, db / 40.0));
	else
		adpcmvol = 0;

	adpcmvolume = (adpcmvol * adpcmlevel) >> 12;
}